

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall
Clasp::Solver::resolveToFlagged(Solver *this,LitVec *in,uint8 vf,LitVec *out,uint32 *outLbd)

{
  uint uVar1;
  Literal p;
  pointer pLVar2;
  pointer puVar3;
  SolverStrategies SVar4;
  CCMinRecursive *pCVar5;
  pointer pDVar6;
  bool bVar7;
  byte bVar8;
  uint32 uVar9;
  size_type sVar10;
  ulong uVar11;
  undefined7 in_register_00000011;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  LitVec temp;
  Literal local_54;
  uint32 *local_50;
  LitVec local_48;
  
  local_48.ebo_.buf = (pointer)0x0;
  local_48.ebo_.size = 0;
  local_48.ebo_.cap = 0;
  (out->ebo_).size = 0;
  uVar12 = (this->assign_).trail.ebo_.size;
  bVar7 = true;
  iVar18 = 0;
  bVar8 = 0;
  local_50 = outLbd;
  do {
    uVar11 = (ulong)(in->ebo_).size;
    uVar13 = (uint)CONCAT71(in_register_00000011,vf);
    if (uVar11 != 0) {
      pLVar2 = (in->ebo_).buf;
      lVar19 = 0;
      do {
        uVar1 = *(uint *)((long)&pLVar2->rep_ + lVar19);
        puVar3 = (this->assign_).assign_.ebo_.buf;
        uVar17 = *(uint *)((long)puVar3 + (ulong)(uVar1 & 0xfffffffc));
        if ((uVar17 & 0xc) == 0) {
          uVar14 = uVar1 >> 2;
          puVar3[uVar14] = uVar17 | 0xc;
          uVar15 = 0;
          if (uVar14 < (this->shared_->varInfo_).ebo_.size) {
            uVar15 = (uint)(this->shared_->varInfo_).ebo_.buf[uVar14].rep;
          }
          if ((uVar13 & ~uVar15) == 0) {
            local_54.rep_ = uVar1 & 0xfffffffe ^ (uint)bVar8 * 2;
            pDVar6 = (this->levels_).super_type.ebo_.buf + ((uVar17 >> 4) - 1);
            *(uint *)pDVar6 = *(uint *)pDVar6 | 0x40000000;
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (out,&local_54);
          }
          else {
            if ((this->assign_).reason_.super_type.ebo_.buf[uVar14].data_ == 0) {
              puVar3[uVar14] = uVar17;
              bVar7 = false;
              break;
            }
            iVar18 = iVar18 + 1;
          }
        }
        lVar19 = lVar19 + 4;
      } while (uVar11 << 2 != lVar19);
    }
    bVar20 = iVar18 == 0;
    iVar18 = iVar18 + -1;
    if (bVar20) {
      uVar12 = (out->ebo_).size;
      uVar11 = (ulong)uVar12;
      if ((bVar8 & bVar7) != 0) {
        SVar4 = this->strategy_;
        pCVar5 = this->ccMin_;
        this->strategy_ = (SolverStrategies)((ulong)SVar4 | 0x400000000000);
        if (pCVar5 != (CCMinRecursive *)0x0) {
          uVar9 = incEpoch(this,(this->assign_).assign_.ebo_.size,2);
          pCVar5->open = uVar9 - 2;
        }
        if (uVar12 == 0) {
          uVar12 = 0;
        }
        else {
          uVar13 = 0;
          do {
            bVar20 = ccRemovable(this,(Literal)((out->ebo_).buf[uVar13].rep_ & 0xfffffffe ^ 2),0,
                                 this->ccMin_);
            if (bVar20) {
              pLVar2 = (out->ebo_).buf;
              uVar11 = (ulong)((int)uVar11 - 1);
              uVar9 = pLVar2[uVar13].rep_;
              pLVar2[uVar13].rep_ = pLVar2[uVar11].rep_;
              pLVar2[uVar11].rep_ = uVar9;
            }
            else {
              uVar13 = uVar13 + 1;
            }
            uVar12 = (uint)uVar11;
          } while (uVar13 != uVar12);
        }
        this->strategy_ =
             (SolverStrategies)
             ((ulong)this->strategy_ & 0xffffbfffffffffff | (ulong)SVar4 & 0x400000000000);
      }
      if (bVar7 == true && uVar12 == 0) {
        Potassco::fail(-1,
                       "bool Clasp::Solver::resolveToFlagged(const LitVec &, const uint8, LitVec &, uint32 &)"
                       ,0x48a,"!ok || outSize != 0","Invalid empty clause - was %u!\n",
                       (ulong)(out->ebo_).size,0);
      }
      *local_50 = 0;
      if (uVar12 != 0) {
        uVar11 = 0;
        iVar18 = 0;
        do {
          puVar3 = (this->assign_).assign_.ebo_.buf;
          uVar16 = (ulong)((out->ebo_).buf[uVar11].rep_ & 0xfffffffc);
          uVar13 = *(uint *)((long)puVar3 + uVar16);
          *(uint *)((long)puVar3 + uVar16) = uVar13 & 0xfffffff3;
          if (0xf < uVar13) {
            uVar13 = uVar13 >> 4;
            pDVar6 = (this->levels_).super_type.ebo_.buf;
            uVar1 = *(uint *)(&pDVar6[-1].field_0x0 + (uVar13 << 4));
            if ((uVar1 >> 0x1e & 1) != 0) {
              *(uint *)(&pDVar6[-1].field_0x0 + (uVar13 << 4)) = uVar1 & 0xbfffffff;
              uVar1 = (this->levels_).root;
              bVar20 = iVar18 == 0;
              iVar18 = iVar18 + (uint)(uVar13 <= uVar1);
              *local_50 = *local_50 + (uint)(bVar20 || uVar1 < uVar13);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      sVar10 = (out->ebo_).size;
      while (uVar12 != sVar10) {
        puVar3 = (this->assign_).assign_.ebo_.buf;
        uVar11 = (ulong)((out->ebo_).buf[sVar10 - 1].rep_ & 0xfffffffc);
        uVar13 = *(uint *)((long)puVar3 + uVar11);
        *(uint *)((long)puVar3 + uVar11) = uVar13 & 0xfffffff3;
        pDVar6 = (this->levels_).super_type.ebo_.buf + ((uVar13 >> 4) - 1);
        *(uint *)pDVar6 = *(uint *)pDVar6 & 0xbfffffff;
        sVar10 = (out->ebo_).size - 1;
        (out->ebo_).size = sVar10;
      }
      if (local_48.ebo_.buf != (pointer)0x0) {
        operator_delete(local_48.ebo_.buf);
      }
      return bVar7;
    }
    puVar3 = (this->assign_).assign_.ebo_.buf;
    do {
      do {
        uVar12 = uVar12 - 1;
        p.rep_ = (this->assign_).trail.ebo_.buf[uVar12].rep_;
        uVar1 = *(uint *)((long)puVar3 + (ulong)(p.rep_ & 0xfffffffc));
      } while (((p.rep_ & 2) * 2 + 4 & uVar1) == 0);
      uVar17 = p.rep_ >> 2;
      uVar14 = 0;
      if (uVar17 < (this->shared_->varInfo_).ebo_.size) {
        uVar14 = (uint)(this->shared_->varInfo_).ebo_.buf[uVar17].rep;
      }
    } while ((uVar13 & ~uVar14) == 0);
    puVar3[uVar17] = uVar1 & 0xfffffff3;
    local_48.ebo_._8_8_ = local_48.ebo_._8_8_ & 0xffffffff00000000;
    bVar8 = 1;
    in = &local_48;
    Antecedent::reason((this->assign_).reason_.super_type.ebo_.buf + uVar17,this,p,in);
  } while( true );
}

Assistant:

bool Solver::resolveToFlagged(const LitVec& in, const uint8 vf, LitVec& out, uint32& outLbd) {
	const LitVec& trail = assign_.trail;
	const LitVec* rhs   = &in;
	LitVec temp; out.clear();
	bool ok = true, first = true;
	for (LitVec::size_type tp = trail.size(), resolve = 0;; first = false) {
		Literal p; Var v;
		for (LitVec::const_iterator it = rhs->begin(), end = rhs->end(); it != end; ++it) {
			p = *it ^ first; v = p.var();
			if (!seen(v)) {
				markSeen(v);
				if      (varInfo(v).hasAll(vf)) { markLevel(level(v)); out.push_back(~p); }
				else if (!reason(p).isNull())   { ++resolve; }
				else                            { clearSeen(v); ok = false; break; }
			}
		}
		if (resolve-- == 0) { break; }
		// find next literal to resolve
		while (!seen(trail[--tp]) || varInfo(trail[tp].var()).hasAll(vf)) { ; }
		clearSeen((p = trail[tp]).var());
		reason(p, temp);
		rhs = &temp;
	}
	LitVec::size_type outSize = out.size();
	if (ok && !first) {
		const uint32 ccAct = strategy_.ccMinKeepAct;
		const uint32 antes = SolverStrategies::all_antes;
		strategy_.ccMinKeepAct = 1;
		if (ccMin_) { ccMinRecurseInit(*ccMin_); }
		for (LitVec::size_type i = 0; i != outSize;) {
			if (!ccRemovable(~out[i], antes, ccMin_)) { ++i; }
			else {
				std::swap(out[i], out[--outSize]);
			}
		}
		strategy_.ccMinKeepAct = ccAct;
	}
	POTASSCO_ASSERT(!ok || outSize != 0, "Invalid empty clause - was %u!\n", out.size());
	outLbd = 0;
	for (uint32 i = 0, dl, root = 0; i != outSize; ++i) {
		Var v = out[i].var();
		dl    = level(v);
		clearSeen(v);
		if (dl && hasLevel(dl)) {
			unmarkLevel(dl);
			outLbd += (dl > rootLevel()) || (++root == 1);
		}
	}
	for (Var v; outSize != out.size(); out.pop_back()) {
		clearSeen(v = out.back().var());
		unmarkLevel(level(v));
	}
	return ok;
}